

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::SegmentO1::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,SegmentO1 *this,RefinementPattern *ref_pat,dim_t codim)

{
  pointer pcVar1;
  Geometry *pGVar2;
  uint uVar3;
  _func_int **pp_Var4;
  _Alloc_hider _Var5;
  uint uVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  runtime_error *prVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong cols;
  pointer *__ptr;
  ulong uVar12;
  long lVar13;
  MatrixXd child_geo;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  stringstream ss;
  string local_278;
  string local_258;
  vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
  *local_238;
  string local_230;
  dim_t local_210;
  scalar_product_op<double,_double> local_209;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_208;
  undefined **local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  double local_1d8;
  scalar_constant_op<double> local_1d0;
  Rhs local_1c8;
  undefined1 local_1b8 [392];
  
  if ((ref_pat->ref_el_).type_ != kSegment) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Refinement pattern for ",0x17);
    local_258._M_dataplus._M_p._0_1_ = (ref_pat->ref_el_).type_;
    lf::base::RefEl::ToString_abi_cxx11_(&local_278,(RefEl *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),local_278._M_dataplus._M_p,local_278._M_string_length);
    paVar8 = &local_278.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar8) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"ref_pat.RefEl() == lf::base::RefEl::kSegment()","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_278,&local_258,0x31,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar8) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Illegal codim = ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"(codim < 2)","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_278,&local_258,0x32,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = ref_pat->lattice_const_;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*ref_pat->_vptr_RefinementPattern[1])(&local_208,ref_pat,(ulong)codim);
  uVar6 = lf::base::narrow<int,unsigned_long>
                    (((long)local_208.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_208.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_210 = codim;
  uVar7 = (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)codim);
  local_238 = (vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
               *)__return_storage_ptr__;
  if (uVar6 != uVar7) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"no_children = ",0xe);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),uVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
    (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)local_210);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"no_children == ref_pat.NumChildren(codim)","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_278,&local_258,0x40,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0 < (int)uVar6) {
    local_1d8 = 1.0 / (double)uVar3;
    cols = (ulong)(2 - local_210);
    local_1e0 = (ulong)uVar6;
    uVar12 = 0;
    local_1f0 = &PTR_DimLocal_003556e0;
    local_1e8 = cols;
    do {
      if (local_208.
          super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12].
          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows != 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"child_polygons[l].rows() = ",0x1b);
        std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"child_polygons[i].rows() == 1","");
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_278,&local_258,0x47,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_208.
          super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12].
          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_cols != cols) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"child_polygons[l].cols() = ",0x1b);
        std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"child_polygons[i].cols() == (2 - codim)","");
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_278,&local_258,0x49,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1d0.m_other = local_1d8;
      local_1c8.m_xpr =
           local_208.
           super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar12;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_278,1,cols,&local_1d0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                       *)local_1b8,(Lhs *)&local_278,&local_1c8,&local_209);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_230,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)local_1b8);
      (*(this->super_Geometry)._vptr_Geometry[3])(&local_258,this,&local_230);
      free(local_230._M_dataplus._M_p);
      if ((local_210 & 1) == 0) {
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
        local_1b8._0_8_ = local_278._M_dataplus._M_p;
        local_278._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_1b8);
        if ((_Head_base<0UL,_lf::geometry::Geometry_*,_false>)local_1b8._0_8_ !=
            (_Head_base<0UL,_lf::geometry::Geometry_*,_false>)0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b8._0_8_)->_M_allocated_capacity + 0x58))();
        }
        local_1b8._0_8_ = (Geometry *)0x0;
      }
      else {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(0x18);
        local_1b8._0_8_ =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             0x0;
        local_1b8._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1b8,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_258);
        _Var5._M_p = local_258._M_dataplus._M_p;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_258,
                   (assign_op<double,_double> *)&local_230);
        cols = local_1e8;
        __return_storage_ptr__ =
             (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
              *)local_238;
        uVar11 = local_1b8._8_8_ - ((long)local_1b8._8_8_ >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)local_1b8._8_8_) {
          lVar13 = 0;
          do {
            pcVar1 = _Var5._M_p + lVar13 * 8;
            pp_Var4 = *(_func_int ***)(pcVar1 + 8);
            pGVar2 = (Geometry *)(local_1b8._0_8_ + lVar13 * 8);
            pGVar2->_vptr_Geometry = *(_func_int ***)pcVar1;
            pGVar2[1]._vptr_Geometry = pp_Var4;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)uVar11);
        }
        if ((long)uVar11 < (long)local_1b8._8_8_) {
          do {
            ((Geometry *)(local_1b8._0_8_ + uVar11 * 8))->_vptr_Geometry =
                 *(_func_int ***)(_Var5._M_p + uVar11 * 8);
            uVar11 = uVar11 + 1;
          } while (local_1b8._8_8_ != uVar11);
        }
        paVar8->_M_allocated_capacity = (size_type)local_1f0;
        ((tuple<lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_> *)
        (&paVar8->_M_allocated_capacity + 1))->
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             = (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                )local_1b8._0_8_;
        (&paVar8->_M_allocated_capacity)[2] = local_1b8._8_8_;
        local_278._M_dataplus._M_p = (pointer)paVar8;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_238,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)&local_278);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_278._M_dataplus._M_p + 0x58))();
      }
      free(local_258._M_dataplus._M_p);
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_1e0);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_208);
  return (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          *)(vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> SegmentO1::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  // The refinement pattern must be for a segment
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kSegment(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG((codim < 2), "Illegal codim = " << codim);

  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Return variable
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};

  // Obtain geometry of children as vector of pairs of lattice coordinates
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child entities
  const int no_children = base::narrow<int>(child_polygons.size());
  LF_VERIFY_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));
  // For each child create a geometry object and a unique pointer to it.
  for (int i = 0; i < no_children; i++) {
    // codim == 0:A single child must be described by an interval, that is
    // two different lattice coordinates
    // codim == 1: a point's location is just one number
    LF_VERIFY_MSG(child_polygons[i].rows() == 1,
                  "child_polygons[l].rows() = " << child_polygons[i].rows());
    LF_VERIFY_MSG(child_polygons[i].cols() == (2 - codim),
                  "child_polygons[l].cols() = " << child_polygons[i].cols());
    // Normalize lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[i].cast<double>()));

    switch (codim) {
      case 0: {
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 1: {
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default:
        LF_VERIFY_MSG(false, "codim out of bounds.");
    }  // end switch codim
  }  // end loop over child entities
  return child_geo_uptrs;
}